

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O2

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator|=(my_set<unsigned_long> *this,my_set<unsigned_long> *b)

{
  my_set<unsigned_long> local_30;
  
  operator|(&local_30,this,b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30);
  return this;
}

Assistant:

my_set<T>& my_set<T>::operator|=(const my_set<T>& b) {
	*this = *this | b;
	return *this;
}